

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,int type)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  int type_local;
  xmlChar *fullattr_local;
  xmlChar *fullname_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->attsSpecial == (xmlHashTablePtr)0x0) {
    pxVar2 = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsSpecial = pxVar2;
    if (ctxt->attsSpecial == (xmlHashTablePtr)0x0) goto LAB_00144d9f;
  }
  iVar1 = xmlHashAdd2(ctxt->attsSpecial,fullname,fullattr,(void *)(long)type);
  if (-1 < iVar1) {
    return;
  }
LAB_00144d9f:
  xmlErrMemory(ctxt);
  return;
}

Assistant:

static void
xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,
		  const xmlChar *fullname,
		  const xmlChar *fullattr,
		  int type)
{
    if (ctxt->attsSpecial == NULL) {
        ctxt->attsSpecial = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsSpecial == NULL)
	    goto mem_error;
    }

    if (xmlHashAdd2(ctxt->attsSpecial, fullname, fullattr,
                    XML_INT_TO_PTR(type)) < 0)
        goto mem_error;
    return;

mem_error:
    xmlErrMemory(ctxt);
}